

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_gif * rf_load_animated_gif_file_ez(rf_gif *__return_storage_ptr__,char *filename)

{
  rf_allocator temp_allocator;
  _Bool _Var1;
  void *__size;
  void *dst;
  void *user_data;
  code *pcVar2;
  undefined8 local_68;
  code *pcStack_60;
  void *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  char *local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  local_68 = 0;
  pcStack_60 = rf_libc_allocator_wrapper;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 0x10) = 0;
  (__return_storage_ptr__->field_2).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->frame_delays = (int *)0x0;
  __size = (void *)rf_libc_get_file_size(__return_storage_ptr__,filename);
  user_data = __size;
  dst = malloc((size_t)__size);
  _Var1 = rf_libc_load_file_into_buffer(user_data,filename,dst,(rf_int)__size);
  pcVar2 = rf_libc_allocator_wrapper;
  if (_Var1) {
    temp_allocator.allocator_proc._0_4_ = (int)pcStack_60;
    temp_allocator.user_data = (void *)local_68;
    temp_allocator.allocator_proc._4_4_ = (int)((ulong)pcStack_60 >> 0x20);
    rf_load_animated_gif
              (__return_storage_ptr__,dst,(rf_int)__size,(rf_allocator)(ZEXT816(0x11ccc8) << 0x40),
               temp_allocator);
    pcVar2 = pcStack_60;
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_38 = "rf_load_animated_gif_file";
  local_30 = 0x46b4;
  uStack_50 = 0;
  local_48 = 0;
  local_58 = dst;
  (*pcVar2)(&local_68,3);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_gif rf_load_animated_gif_file_ez(const char* filename) { return rf_load_animated_gif_file(filename, RF_DEFAULT_ALLOCATOR, RF_DEFAULT_ALLOCATOR, RF_DEFAULT_IO); }